

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::HttpResponseHeader::GetReason_abi_cxx11_
          (string *__return_storage_ptr__,HttpResponseHeader *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_reason);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpResponseHeader::GetReason() const
{
    return m_reason;
}